

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

void __thiscall libsgp4::Util::TrimLeft(Util *this,string *s)

{
  _Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::__0> *p_Var1;
  _Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::__0> *p_Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::__0> *this_00;
  _Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::__0> *p_Var6;
  
  p_Var2 = *(_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::__0> **)this;
  lVar5 = *(long *)(this + 8);
  p_Var1 = p_Var2 + lVar5;
  this_00 = p_Var2;
  for (lVar4 = lVar5 >> 2; p_Var6 = this_00, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
            operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )s);
    if (bVar3) goto LAB_00109522;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
            operator()(this_00 + 1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var6 = this_00 + 1;
    if (bVar3) goto LAB_00109522;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
            operator()(this_00 + 2,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var6 = this_00 + 2;
    if (bVar3) goto LAB_00109522;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
            operator()(this_00 + 3,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var6 = this_00 + 3;
    if (bVar3) goto LAB_00109522;
    this_00 = this_00 + 4;
    lVar5 = lVar5 + -4;
  }
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      p_Var6 = p_Var1;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>
                  ::operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )s), p_Var6 = this_00, bVar3)) goto LAB_00109522;
      p_Var6 = this_00 + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
            operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )s);
    if (bVar3) goto LAB_00109522;
    this_00 = p_Var6 + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<libsgp4::Util::TrimLeft(std::__cxx11::string&)::$_0>::
          operator()(this_00,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )s);
  p_Var6 = p_Var1;
  if (bVar3) {
    p_Var6 = this_00;
  }
LAB_00109522:
  std::__cxx11::string::erase(this,p_Var2,p_Var6);
  return;
}

Assistant:

void TrimLeft(std::string& s)
    {
        s.erase(s.begin(),
                std::find_if(s.begin(), s.end(), [](unsigned char c){ return std::isgraph(c) != 0; }));
    }